

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  int iVar1;
  Data *pDVar2;
  uint *puVar3;
  InputStreamMutex *pIVar4;
  Compressor *pCVar5;
  char *pcVar6;
  IStream *pIVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  ulong uVar13;
  uint *puVar14;
  ostream *poVar15;
  ArgExc *pAVar16;
  long lVar17;
  int iVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  char *readPtr;
  char b [4];
  stringstream _iex_replace_s;
  char *local_378;
  int local_370;
  int local_36c;
  char *local_368;
  pthread_mutex_t *local_360;
  long local_350;
  long local_348;
  uint local_340;
  undefined4 uStack_33c;
  ostream local_330 [768];
  
  if (this->_data->frameBufferValid == false) {
    pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar16,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  local_360 = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(local_360);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  iVar11 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  iVar10 = scanline1;
  if (scanline2 < scanline1) {
    iVar10 = scanline2;
  }
  if (this->_data->minY <= iVar10) {
    iVar27 = scanline2;
    if (scanline2 < scanline1) {
      iVar27 = scanline1;
    }
    if (iVar27 <= this->_data->maxY) {
      iVar27 = scanline1;
      if (scanline2 < scanline1) {
        iVar27 = scanline2;
      }
      lVar22 = (long)iVar27;
      iVar10 = ((scanline1 + scanline2) - iVar10) + 1;
      local_368 = "Unexpected part number.";
      local_370 = iVar10;
      do {
        pDVar2 = this->_data;
        iVar18 = pDVar2->minY;
        uVar13 = (long)(int)lVar22 - (long)iVar18;
        if ((pDVar2->gotSampleCount)._data[uVar13] == true) {
          iVar26 = pDVar2->minX;
          if (iVar26 <= pDVar2->maxX) {
            iVar1 = pDVar2->sampleCountXStride;
            lVar17 = (long)iVar26 + -1;
            puVar14 = (uint *)(pDVar2->sampleCountSliceBase +
                              (long)iVar26 * (long)iVar1 + pDVar2->sampleCountYStride * lVar22);
            lVar21 = (pDVar2->sampleCount)._sizeY;
            puVar3 = (pDVar2->sampleCount)._data;
            do {
              *puVar14 = puVar3[((long)iVar27 - (long)iVar18) * lVar21 +
                                ((lVar17 + 1) - (long)pDVar2->minX)];
              lVar17 = lVar17 + 1;
              puVar14 = (uint *)((long)puVar14 + (long)iVar1);
            } while (lVar17 < pDVar2->maxX);
          }
        }
        else {
          pIVar4 = pDVar2->_streamData;
          iVar10 = (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                        (long)pDVar2->linesInBuffer);
          local_36c = iVar27;
          local_350 = lVar22;
          (*pIVar4->is->_vptr_IStream[6])
                    (pIVar4->is,
                     (pDVar2->lineOffsets).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10]);
          if (((pDVar2->version & 0x1000) != 0) &&
             ((*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4),
             local_340 != pDVar2->partNumber)) {
LAB_004c768d:
            pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar16,local_368);
            __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,4);
          uVar12 = local_340;
          lVar22 = (long)(int)local_340;
          if (local_340 != pDVar2->linesInBuffer * iVar10 + pDVar2->minY) {
            local_368 = "Unexpected data block y coordinate.";
            goto LAB_004c768d;
          }
          iVar27 = local_340 + pDVar2->linesInBuffer + -1;
          if (pDVar2->maxY < iVar27) {
            iVar27 = pDVar2->maxY;
          }
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,8);
          uVar13 = CONCAT44(uStack_33c,local_340);
          if ((ulong)(long)pDVar2->maxSampleCountTableSize < uVar13) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Bad sampleCountTableDataSize read from chunk ",0x2d);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,": expected ",0xb);
            poVar15 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar15,pDVar2->maxSampleCountTableSize);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," or less, got ",0xe);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&local_340);
            __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,8);
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,&local_340,8);
          if (uVar13 >> 0x1f != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"This version of the library does not ",0x25);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"support the allocation of data with size  > ",0x2c);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_330,0x7fffffff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," file table size    :",0x15)
            ;
            poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,".\n",2);
            pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&local_340);
            __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
          }
          uVar9 = CONCAT44(uStack_33c,local_340);
          (*pIVar4->is->_vptr_IStream[3])(pIVar4->is,(pDVar2->sampleCountTableBuffer)._data);
          if (uVar13 < (ulong)(long)pDVar2->maxSampleCountTableSize) {
            pCVar5 = pDVar2->sampleCountTableComp;
            if (pCVar5 == (Compressor *)0x0) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_330,"Deep scanline data corrupt at chunk ",0x24);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15," (sampleCountTableDataSize error)",0x21);
              pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&local_340);
              __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
            }
            (*pCVar5->_vptr_Compressor[6])
                      (pCVar5,(pDVar2->sampleCountTableBuffer)._data,uVar13,(ulong)uVar12,&local_378
                      );
          }
          else {
            local_378 = (pDVar2->sampleCountTableBuffer)._data;
          }
          if ((int)uVar12 <= iVar27) {
            pcVar6 = pDVar2->sampleCountSliceBase;
            local_348 = (long)pDVar2->sampleCountYStride;
            iVar18 = pDVar2->sampleCountXStride;
            puVar3 = (pDVar2->lineSampleCount)._data;
            uVar13 = (ulong)(uint)pDVar2->minY;
            lVar17 = 0;
            pcVar20 = local_378;
            do {
              lVar21 = lVar22 - (int)uVar13;
              puVar3[lVar21] = 0;
              if (pDVar2->maxX < pDVar2->minX) {
                uVar13 = 0;
              }
              else {
                lVar25 = (long)pDVar2->minX;
                uVar12 = 0;
                do {
                  lVar24 = 0;
                  pcVar19 = pcVar20;
                  do {
                    pcVar20 = pcVar19 + 1;
                    *(char *)((long)&local_340 + lVar24) = *pcVar19;
                    lVar24 = lVar24 + 1;
                    pcVar19 = pcVar20;
                  } while ((int)lVar24 != 4);
                  uVar23 = local_340 - uVar12;
                  local_378 = pcVar20;
                  if ((int)local_340 < (int)uVar12) {
                    iex_debugTrap();
                    std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (local_330,"Deep scanline sampleCount data corrupt at chunk ",0x30);
                    poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar10);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15," (negative sample count detected)",0x21);
                    pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&local_340);
                    __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
                  }
                  (pDVar2->sampleCount)._data
                  [(pDVar2->sampleCount)._sizeY * lVar21 + (lVar25 - pDVar2->minX)] = uVar23;
                  puVar3[lVar21] = puVar3[lVar21] + uVar23;
                  *(uint *)(pcVar6 + lVar25 * iVar18 + lVar22 * local_348) = uVar23;
                  bVar8 = lVar25 < pDVar2->maxX;
                  lVar25 = lVar25 + 1;
                  uVar12 = local_340;
                } while (bVar8);
                uVar13 = (ulong)puVar3[lVar21];
              }
              lVar17 = lVar17 + uVar13;
              uVar13 = pDVar2->combinedSampleSize * lVar17;
              if (uVar9 <= uVar13 && uVar13 - uVar9 != 0) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_330,"Deep scanline sampleCount data corrupt at chunk ",0x30);
                poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,": pixel data only contains ",0x1b);
                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15," bytes of data but table references at least ",0x2d);
                poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15," bytes of sample data",0x15);
                pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar16,(stringstream *)&local_340);
                __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
              }
              uVar13 = (ulong)pDVar2->minY;
              (pDVar2->gotSampleCount)._data[lVar22 - uVar13] = true;
              lVar22 = lVar22 + 1;
            } while (iVar27 + 1 != (int)lVar22);
          }
          pDVar2 = this->_data;
          iVar26 = iVar10 * pDVar2->linesInBuffer + pDVar2->minY;
          iVar18 = pDVar2->linesInBuffer + iVar26 + -1;
          if (pDVar2->maxY < iVar18) {
            iVar18 = pDVar2->maxY;
          }
          bytesPerDeepLineTable
                    (&pDVar2->header,iVar26,iVar18,pDVar2->sampleCountSliceBase,
                     pDVar2->sampleCountXStride,pDVar2->sampleCountYStride,&pDVar2->bytesPerLine);
          iVar27 = local_36c;
          iVar10 = local_370;
          pDVar2 = this->_data;
          offsetInLineBufferTable
                    (&pDVar2->bytesPerLine,iVar26 - pDVar2->minY,iVar18 - pDVar2->minY,
                     pDVar2->linesInBuffer,&pDVar2->offsetInLineBuffer);
          lVar22 = local_350;
        }
        lVar22 = lVar22 + 1;
        iVar27 = iVar27 + 1;
        if (iVar10 == (int)lVar22) {
          pIVar7 = this->_data->_streamData->is;
          (*pIVar7->_vptr_IStream[6])(pIVar7,CONCAT44(extraout_var,iVar11));
          pthread_mutex_unlock(local_360);
          return;
        }
      } while( true );
    }
  }
  pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (pAVar16,"Tried to read scan line sample counts outside the image file\'s data window.")
  ;
  __cxa_throw(pAVar16,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    Int64 savedFilePos = 0;

    if(!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc("readPixelSampleCounts called with no valid frame buffer");
    }
    
    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line sample counts outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, it'll be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (_data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache(i,_data);
                                         
            }else{

                int lineBlockId = ( i - _data->minY ) / _data->linesInBuffer;

                readSampleCountForLineBlock ( _data->_streamData, _data, lineBlockId );

                int minYInLineBuffer = lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min ( minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY );

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable ( _data->header,
                                        minYInLineBuffer,
                                        maxYInLineBuffer,
                                        _data->sampleCountSliceBase,
                                        _data->sampleCountXStride,
                                        _data->sampleCountYStride,
                                        _data->bytesPerLine );

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable ( _data->bytesPerLine,
                                          minYInLineBuffer - _data->minY,
                                          maxYInLineBuffer - _data->minY,
                                          _data->linesInBuffer,
                                          _data->offsetInLineBuffer );
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

        _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}